

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_ProcessSideTextures
               (bool checktranmap,side_t *sd,sector_t *sec,intmapsidedef_t *msd,int special,int tag,
               short *alpha,FMissingTextureTracker *missingtex)

{
  char *pcVar1;
  bool bVar2;
  FTextureID FVar3;
  int iVar4;
  int iVar5;
  FDynamicColormap *pFVar6;
  int s;
  long lVar7;
  long lVar8;
  FDynamicColormap *colormap;
  anon_union_4_2_12391d7c_for_PalEntry_0 fade;
  anon_union_4_2_12391d7c_for_PalEntry_0 color;
  bool local_3e;
  bool local_3d;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_3c;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_38;
  FTextureID local_34;
  
  if (special < 0xd0) {
    if (special == 0xa0) {
      pcVar1 = (msd->toptexture).Chars;
      if (*pcVar1 == '#') {
        local_34.texnum = 0;
        lVar7 = strtol(pcVar1 + 1,(char **)0x0,10);
        FVar3 = FTextureID::operator+(&local_34,-(int)lVar7);
        sd->textures[0].texture.texnum = FVar3.texnum;
      }
      else {
        SetTexture(sd,0,pcVar1,missingtex);
      }
      SetTexture(sd,1,(msd->midtexture).Chars,missingtex);
      SetTexture(sd,2,(msd->bottomtexture).Chars,missingtex);
      return;
    }
    if (special == 0xbe) {
      local_38.d = 0xffffff;
      local_3c.d = 0;
      SetTextureNoErr(sd,2,&local_3c.d,(msd->bottomtexture).Chars,&local_3e,true);
      SetTextureNoErr(sd,0,&local_38.d,(msd->toptexture).Chars,&local_3d,false);
      SetTexture(sd,1,(msd->midtexture).Chars,missingtex);
      if (local_3e == false && local_3d == false) {
        return;
      }
      if (numsectors < 1) {
        return;
      }
      lVar8 = 0x100;
      lVar7 = 0;
      pFVar6 = (FDynamicColormap *)0x0;
      fade = local_3c;
      color = local_38;
      do {
        bVar2 = FTagManager::SectorHasTag(&tagManager,(int)lVar7,tag);
        if (bVar2) {
          if (local_3d == false) {
            color = (anon_union_4_2_12391d7c_for_PalEntry_0)
                    *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
                     &((anon_union_4_2_12391d7c_for_PalEntry_0 *)
                      (*(long *)((long)&sectors->planes[0].xform.xOffs + lVar8) + 8))->field_0;
          }
          if (local_3e == false) {
            fade = (anon_union_4_2_12391d7c_for_PalEntry_0)
                   *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
                    &((anon_union_4_2_12391d7c_for_PalEntry_0 *)
                     (*(long *)((long)&sectors->planes[0].xform.xOffs + lVar8) + 0xc))->field_0;
          }
          if (((pFVar6 == (FDynamicColormap *)0x0) || ((pFVar6->Color).field_0.d != color.d)) ||
             ((pFVar6->Fade).field_0.d != fade.d)) {
            pFVar6 = GetSpecialLights((PalEntry)color.field_0,(PalEntry)fade.field_0,0);
          }
          *(FDynamicColormap **)((long)&sectors->planes[0].xform.xOffs + lVar8) = pFVar6;
        }
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 0x268;
      } while (lVar7 < numsectors);
      return;
    }
  }
  else if (special == 0xd0) {
    if (checktranmap) {
      pcVar1 = (msd->midtexture).Chars;
      iVar4 = strncasecmp("TRANMAP",pcVar1,8);
      if (iVar4 != 0) {
        iVar4 = FWadCollection::CheckNumForName(&Wads,pcVar1,0);
        if ((iVar4 < 1) || (iVar5 = FWadCollection::LumpLength(&Wads,iVar4), iVar5 != 0x10000))
        goto LAB_00565217;
        iVar4 = P_DetermineTranslucency(iVar4);
        *alpha = (short)iVar4;
      }
      sd->textures[1].texture.texnum = 0;
      goto LAB_0056522b;
    }
  }
  else if (special == 0xd1) {
    if (sec == (sector_t *)0x0) {
      return;
    }
    SetTexture(sd,2,&sec->bottommap,(msd->bottomtexture).Chars);
    SetTexture(sd,1,&sec->midmap,(msd->midtexture).Chars);
    SetTexture(sd,0,&sec->topmap,(msd->toptexture).Chars);
    return;
  }
LAB_00565217:
  SetTexture(sd,1,(msd->midtexture).Chars,missingtex);
LAB_0056522b:
  SetTexture(sd,0,(msd->toptexture).Chars,missingtex);
  SetTexture(sd,2,(msd->bottomtexture).Chars,missingtex);
  return;
}

Assistant:

void P_ProcessSideTextures(bool checktranmap, side_t *sd, sector_t *sec, intmapsidedef_t *msd, int special, int tag, short *alpha, FMissingTextureTracker &missingtex)
{
	switch (special)
	{
	case Transfer_Heights:	// variable colormap via 242 linedef
		  // [RH] The colormap num we get here isn't really a colormap,
		  //	  but a packed ARGB word for blending, so we also allow
		  //	  the blend to be specified directly by the texture names
		  //	  instead of figuring something out from the colormap.
		if (sec != NULL)
		{
			SetTexture (sd, side_t::bottom, &sec->bottommap, msd->bottomtexture);
			SetTexture (sd, side_t::mid, &sec->midmap, msd->midtexture);
			SetTexture (sd, side_t::top, &sec->topmap, msd->toptexture);
		}
		break;

	case Static_Init:
		// [RH] Set sector color and fog
		// upper "texture" is light color
		// lower "texture" is fog color
		{
			DWORD color = MAKERGB(255,255,255), fog = 0;
			bool colorgood, foggood;

			SetTextureNoErr (sd, side_t::bottom, &fog, msd->bottomtexture, &foggood, true);
			SetTextureNoErr (sd, side_t::top, &color, msd->toptexture, &colorgood, false);
			SetTexture(sd, side_t::mid, msd->midtexture, missingtex);

			if (colorgood | foggood)
			{
				int s;
				FDynamicColormap *colormap = NULL;

				for (s = 0; s < numsectors; s++)
				{
					if (tagManager.SectorHasTag(s, tag))
					{
						if (!colorgood) color = sectors[s].ColorMap->Color;
						if (!foggood) fog = sectors[s].ColorMap->Fade;
						if (colormap == NULL ||
							colormap->Color != color ||
							colormap->Fade != fog)
						{
							colormap = GetSpecialLights (color, fog, 0);
						}
						sectors[s].ColorMap = colormap;
					}
				}
			}
		}
		break;

	case Sector_Set3DFloor:
		if (msd->toptexture[0]=='#')
		{
			sd->SetTexture(side_t::top, FNullTextureID() +(-strtol(&msd->toptexture[1], NULL, 10)));	// store the alpha as a negative texture index
														// This will be sorted out by the 3D-floor code later.
		}
		else
		{
			SetTexture(sd, side_t::top, msd->toptexture, missingtex);
		}

		SetTexture(sd, side_t::mid, msd->midtexture, missingtex);
		SetTexture(sd, side_t::bottom, msd->bottomtexture, missingtex);
		break;

	case TranslucentLine:	// killough 4/11/98: apply translucency to 2s normal texture
		if (checktranmap)
		{
			int lumpnum;

			if (strnicmp ("TRANMAP", msd->midtexture, 8) == 0)
			{
				// The translator set the alpha argument already; no reason to do it again.
				sd->SetTexture(side_t::mid, FNullTextureID());
			}
			else if ((lumpnum = Wads.CheckNumForName (msd->midtexture)) > 0 &&
				Wads.LumpLength (lumpnum) == 65536)
			{
				*alpha = (short)P_DetermineTranslucency (lumpnum);
				sd->SetTexture(side_t::mid, FNullTextureID());
			}
			else
			{
				SetTexture(sd, side_t::mid, msd->midtexture, missingtex);
			}

			SetTexture(sd, side_t::top, msd->toptexture, missingtex);
			SetTexture(sd, side_t::bottom, msd->bottomtexture, missingtex);
			break;
		}
		// Fallthrough for Hexen maps is intentional

	default:			// normal cases

		SetTexture(sd, side_t::mid, msd->midtexture, missingtex);
		SetTexture(sd, side_t::top, msd->toptexture, missingtex);
		SetTexture(sd, side_t::bottom, msd->bottomtexture, missingtex);
		break;
	}
}